

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

ssl_private_key_result_t
AsyncPrivateKeyDecrypt
          (SSL *ssl,uint8_t *out,size_t *out_len,size_t max_out,uint8_t *in,size_t in_len)

{
  uint8_t *out_00;
  uint uVar1;
  int iVar2;
  ssl_private_key_result_t sVar3;
  TestState *pTVar4;
  EVP_PKEY *pkey;
  RSA *rsa;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  char *__ptr;
  size_t sStackY_60;
  
  pTVar4 = GetTestState(ssl);
  pTVar4->used_private_key = true;
  if ((pTVar4->private_key_result).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pTVar4->private_key_result).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pkey = GetPrivateKey(ssl);
    rsa = EVP_PKEY_get0_RSA(pkey);
    if (rsa != (RSA *)0x0) {
      this = &pTVar4->private_key_result;
      uVar1 = RSA_size((RSA *)rsa);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,(ulong)uVar1);
      out_00 = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = RSA_size((RSA *)rsa);
      iVar2 = RSA_decrypt(rsa,out_len,out_00,(ulong)uVar1,in,in_len,3);
      if (iVar2 != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,*out_len);
        sVar3 = AsyncPrivateKeyComplete(ssl,out,out_len,max_out);
        return sVar3;
      }
      return ssl_private_key_failure;
    }
    __ptr = "AsyncPrivateKeyDecrypt called with incorrect key type.\n";
    sStackY_60 = 0x37;
  }
  else {
    __ptr = "AsyncPrivateKeyDecrypt called with operation pending.\n";
    sStackY_60 = 0x36;
  }
  fwrite(__ptr,sStackY_60,1,_stderr);
  abort();
}

Assistant:

static ssl_private_key_result_t AsyncPrivateKeyDecrypt(SSL *ssl, uint8_t *out,
                                                       size_t *out_len,
                                                       size_t max_out,
                                                       const uint8_t *in,
                                                       size_t in_len) {
  TestState *test_state = GetTestState(ssl);
  test_state->used_private_key = true;
  if (!test_state->private_key_result.empty()) {
    fprintf(stderr, "AsyncPrivateKeyDecrypt called with operation pending.\n");
    abort();
  }

  EVP_PKEY *private_key = GetPrivateKey(ssl);
  RSA *rsa = EVP_PKEY_get0_RSA(private_key);
  if (rsa == NULL) {
    fprintf(stderr, "AsyncPrivateKeyDecrypt called with incorrect key type.\n");
    abort();
  }
  test_state->private_key_result.resize(RSA_size(rsa));
  if (!RSA_decrypt(rsa, out_len, test_state->private_key_result.data(),
                   RSA_size(rsa), in, in_len, RSA_NO_PADDING)) {
    return ssl_private_key_failure;
  }

  test_state->private_key_result.resize(*out_len);

  return AsyncPrivateKeyComplete(ssl, out, out_len, max_out);
}